

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O1

ostream * operator<<(ostream *out,
                    FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *map)

{
  pointer ppVar1;
  ostream *poVar2;
  char *pcVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float> *v;
  pointer ppVar4;
  long lVar5;
  bool bVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{ ",2);
  ppVar4 = (map->vec_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (map->vec_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    lVar5 = 0;
    do {
      bVar6 = lVar5 != 0;
      lVar5 = lVar5 + -1;
      pcVar3 = ", ";
      if (!bVar6) {
        pcVar3 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,(ulong)((uint)bVar6 * 2));
      std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(ppVar4->first)._M_dataplus._M_p,(ppVar4->first)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] -> ",5);
      std::ostream::_M_insert<double>((double)ppVar4->second);
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const FlatMap<Key, Value, Compare>& map) {
    out << "{ ";
    size_t i = 0;
    for (const auto& v : map) {
        out << (i++ == 0 ? "" : ", ") << "[" << v.first << "] -> " << v.second;
    }
    return out << " }";
}